

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O3

void Map_MappingSetupTruthTablesLarge(uint (*uTruths) [32])

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  uint *puVar4;
  long lVar5;
  uint (*pauVar6) [32];
  long lVar7;
  undefined1 auVar8 [16];
  
  auVar2 = _DAT_0093d220;
  auVar1 = _DAT_0093d210;
  lVar3 = 0;
  puVar4 = *uTruths;
  do {
    lVar5 = 0x80;
    auVar8 = auVar1;
    do {
      if (SUB164(auVar8 ^ auVar2,4) == -0x80000000 && SUB164(auVar8 ^ auVar2,0) < -0x7ffffff6) {
        *(undefined4 *)((long)puVar4 + lVar5 + -0x80) = 0;
        *(undefined4 *)((long)puVar4 + lVar5) = 0;
      }
      lVar7 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 0x100;
    } while (lVar5 != 0x580);
    lVar3 = lVar3 + 1;
    puVar4 = puVar4 + 1;
  } while (lVar3 != 0x20);
  lVar3 = 0x280;
  lVar5 = 0;
  do {
    lVar7 = 0;
    pauVar6 = uTruths;
    do {
      if (((uint)lVar5 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
        (*pauVar6)[0] = (*pauVar6)[0] | 1 << ((byte)lVar5 & 0x1f);
        *(undefined4 *)((long)*pauVar6 + lVar3) = 0xffffffff;
      }
      lVar7 = lVar7 + 1;
      pauVar6 = pauVar6 + 1;
    } while (lVar7 != 5);
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 4;
  } while (lVar5 != 0x20);
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      *(undefined4 *)((long)*uTruths + lVar7 + lVar3) = *(undefined4 *)((long)*uTruths + lVar7);
      lVar7 = lVar7 + 0x80;
    } while (lVar7 != 0x280);
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 4;
  } while (lVar5 != 0x20);
  return;
}

Assistant:

void Map_MappingSetupTruthTablesLarge( unsigned uTruths[][32] )
{
    int m, v;
    // clean everything
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 10; v++ )
            uTruths[v][m] = 0;
    // set up the truth tables
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 5; v++ )
            if ( m & (1 << v) )
            {
                uTruths[v][0] |= (1 << m);
                uTruths[v+5][m] = MAP_FULL;
            }
    // extend this info for the rest of the first 5 variables
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 5; v++ )
            uTruths[v][m] = uTruths[v][0];
/*
    // verify
    for ( m = 0; m < 1024; m++, printf("\n") )
        for ( v = 0; v < 10; v++ )
            if ( Map_InfoReadVar( uTruths[v], m ) )
                printf( "1" );
            else
                printf( "0" );
*/
}